

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O1

bool __thiscall CaptureSummary::Merge(CaptureSummary *this,size_t nb_summaries,CaptureSummary **cs)

{
  uint uVar1;
  CaptureLine *x;
  pointer pp_Var2;
  CaptureSummary *pCVar3;
  pointer __last;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  _capture_line *p_Var11;
  ulong uVar12;
  size_type __n;
  bool bVar13;
  uint64_t uVar14;
  long lVar15;
  pointer pp_Var16;
  int i;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> complete;
  CaptureLine *local_leak;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> frequent_tld;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> leaked_2ld;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> leaked_tld;
  CaptureLine *tld_line;
  CaptureLine current_line;
  uint64_t skipped_tld_length [64];
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> local_498;
  CaptureSummary *local_478;
  _capture_line *local_470;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> local_468;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> local_448;
  vector<_capture_line_*,_std::allocator<_capture_line_*>_> local_428;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  size_t local_3f0;
  ulong local_3e8;
  char *local_3e0;
  _capture_line *local_3d8 [8];
  int local_398;
  anon_union_128_2_8b70880b_for__capture_line_2 local_394;
  uint64_t local_310;
  CaptureLine local_308;
  uint64_t local_238 [65];
  
  local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_start = (_capture_line **)0x0;
  local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (_capture_line **)0x0;
  local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (_capture_line **)0x0;
  local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (_capture_line **)0x0;
  local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_start = (_capture_line **)0x0;
  local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (_capture_line **)0x0;
  local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (_capture_line **)0x0;
  local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_start = (_capture_line **)0x0;
  local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (_capture_line **)0x0;
  local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (_capture_line **)0x0;
  local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_start = (_capture_line **)0x0;
  local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (_capture_line **)0x0;
  local_478 = this;
  local_470 = (_capture_line *)operator_new(0xd0);
  memset(local_238,0,0x200);
  local_408 = DnsStats::GetTableName(0x1d);
  local_3e0 = DnsStats::GetTableName(0x38);
  local_400 = DnsStats::GetTableName(0x26);
  local_3f8 = DnsStats::GetTableName(0x28);
  local_410 = DnsStats::GetTableName(0x1c);
  pcVar7 = DnsStats::GetTableName(0x3a);
  pcVar8 = DnsStats::GetTableName(0x39);
  bVar20 = local_408 != (char *)0x0;
  bVar21 = local_400 != (char *)0x0;
  bVar22 = local_3f8 != (char *)0x0;
  bVar23 = local_410 != (char *)0x0;
  bVar24 = local_470 != (_capture_line *)0x0;
  bVar25 = pcVar7 != (char *)0x0;
  bVar26 = pcVar8 != (char *)0x0;
  bVar13 = bVar26 && ((bVar25 && ((bVar23 && bVar22) && (bVar21 && bVar20))) && bVar24);
  bVar5 = !bVar26 || ((!bVar25 || ((!bVar23 || !bVar22) || (!bVar21 || !bVar20))) || !bVar24);
  if (nb_summaries == 0 || bVar5) {
    __n = 0;
    local_3e8 = 0;
  }
  else {
    uVar9 = 1;
    local_3e8 = 0;
    __n = 0;
    do {
      uVar12 = (long)(cs[uVar9 - 1]->summary).
                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(cs[uVar9 - 1]->summary).
                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      if (local_3e8 < uVar12) {
        local_3e8 = uVar12;
      }
      __n = __n + uVar12;
      bVar19 = uVar9 < nb_summaries;
      uVar9 = uVar9 + 1;
    } while (bVar13 && bVar19);
  }
  if (bVar26 && ((bVar25 && ((bVar23 && bVar22) && (bVar21 && bVar20))) && bVar24)) {
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve(&local_498,__n);
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
              (&local_428,nb_summaries * 0x30);
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
              (&local_448,nb_summaries * 0x30);
    std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
              (&local_468,nb_summaries * 0x10);
  }
  local_3f0 = nb_summaries;
  if (bVar5 || nb_summaries == 0) {
    uVar14 = 0;
  }
  else {
    uVar9 = 0;
    uVar14 = 0;
    do {
      pp_Var16 = (cs[uVar9]->summary).
                 super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((cs[uVar9]->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != pp_Var16) {
        uVar12 = 0;
        do {
          p_Var11 = pp_Var16[uVar12];
          iVar6 = strcmp(p_Var11->registry_name,local_400);
          if (iVar6 == 0) {
            sVar10 = strlen((p_Var11->field_2).key_value);
            bVar5 = DnsStats::IsFrequentLeakTld((uint8_t *)(p_Var11->field_2).key_value,sVar10);
            pp_Var16 = (cs[uVar9]->summary).
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_start + uVar12;
            if (bVar5) {
              if (local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                *local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish = *pp_Var16;
                goto LAB_001522c6;
              }
LAB_001522ce:
              std::vector<_capture_line*,std::allocator<_capture_line*>>::
              _M_realloc_insert<_capture_line*const&>
                        ((vector<_capture_line*,std::allocator<_capture_line*>> *)&local_498,
                         (iterator)
                         local_498.
                         super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,pp_Var16);
            }
            else {
              uVar14 = uVar14 + (*pp_Var16)->count;
            }
          }
          else {
            pp_Var16 = pp_Var16 + uVar12;
            iVar6 = strcmp(p_Var11->registry_name,local_408);
            if ((iVar6 == 0) && (p_Var11->count < 5)) {
              sVar10 = strlen((p_Var11->field_2).key_value);
              if (sVar10 < 0x40) {
                local_238[sVar10] = local_238[sVar10] + 1;
              }
            }
            else {
              if (local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001522ce;
              *local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
               _M_impl.super__Vector_impl_data._M_finish = p_Var11;
LAB_001522c6:
              local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar12 = uVar12 + 1;
          pp_Var16 = (cs[uVar9]->summary).
                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (uVar12 < (ulong)((long)(cs[uVar9]->summary).
                                        super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var16
                                 >> 3));
      }
      uVar9 = uVar9 + 1;
    } while (bVar13 && uVar9 < local_3f0);
  }
  sVar4 = local_3f0;
  pcVar7 = local_3f8;
  p_Var11 = local_470;
  if (bVar13 && uVar14 != 0) {
    local_470->count = uVar14;
    *(undefined8 *)&local_470->key_type = 0;
    sVar10 = strlen(local_3f8);
    memcpy(p_Var11,pcVar7,sVar10 + 1);
    if (local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<_capture_line*,std::allocator<_capture_line*>>::
      _M_realloc_insert<_capture_line*const&>
                ((vector<_capture_line*,std::allocator<_capture_line*>> *)&local_498,
                 (iterator)
                 local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_470);
    }
    else {
      *local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
       super__Vector_impl_data._M_finish = local_470;
      local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  pp_Var2 = local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pp_Var16 = local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar9 = (long)local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar18 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e
               ,(_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)CaptureLineIsLower);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )pp_Var16,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )pp_Var2,
               (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)CaptureLineIsLower);
  }
  std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>::reserve
            (&local_478->summary,local_3e8 + sVar4 * 0x40);
  if (!bVar26 || ((!bVar25 || ((!bVar23 || !bVar22) || (!bVar21 || !bVar20))) || !bVar24)) {
LAB_00152890:
    if (local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar9 = 0;
      do {
        if (local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] != (_capture_line *)0x0) {
          operator_delete(local_468.
                          super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar9]);
          local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = (_capture_line *)0x0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)local_468.
                                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_468.
                                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar9 = 0;
      do {
        if (local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] != (_capture_line *)0x0) {
          operator_delete(local_428.
                          super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar9]);
          local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = (_capture_line *)0x0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)local_428.
                                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_428.
                                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar9 = 0;
      do {
        if (local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] != (_capture_line *)0x0) {
          operator_delete(local_448.
                          super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar9]);
          local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = (_capture_line *)0x0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)local_448.
                                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_448.
                                     super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (local_470 != (_capture_line *)0x0) {
      operator_delete(local_470);
      local_470 = (_capture_line *)0x0;
    }
    if (local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start != (_capture_line **)0x0) {
      operator_delete(local_468.
                      super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start != (_capture_line **)0x0) {
      operator_delete(local_448.
                      super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start != (_capture_line **)0x0) {
      operator_delete(local_428.
                      super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_start != (_capture_line **)0x0) {
      operator_delete(local_498.
                      super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return bVar13;
  }
  uVar9 = 0;
  while (__last = local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish,
        pp_Var2 = local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        pp_Var16 = local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
        uVar12 = (long)local_498.
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)local_498.
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3, uVar9 < uVar12) {
    memcpy(&local_308,
           local_498.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar9],0xd0);
    uVar17 = uVar9 + 1;
    uVar9 = uVar17;
    if (uVar17 < uVar12) {
      do {
        uVar14 = local_308.count;
        x = pp_Var16[uVar17];
        bVar5 = CaptureLineIsSameKey(x,&local_308);
        uVar9 = uVar17;
        if (!bVar5) break;
        local_308.count = uVar14 + x->count;
        uVar17 = uVar17 + 1;
        uVar9 = uVar12;
      } while (uVar12 != uVar17);
    }
    iVar6 = strcmp(local_308.registry_name,local_408);
    pCVar3 = local_478;
    if (iVar6 == 0) {
      p_Var11 = (_capture_line *)operator_new(0xd0);
      local_3d8[0] = p_Var11;
      memcpy(p_Var11,&local_308,0xd0);
      if (local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<_capture_line*,std::allocator<_capture_line*>>::
        _M_realloc_insert<_capture_line*const&>
                  ((vector<_capture_line*,std::allocator<_capture_line*>> *)&local_428,
                   (iterator)
                   local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,local_3d8);
      }
      else {
        *local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
         super__Vector_impl_data._M_finish = p_Var11;
        local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
             .super__Vector_impl_data._M_finish + 1;
      }
    }
    else {
      iVar6 = strcmp(local_308.registry_name,local_3e0);
      if (iVar6 == 0) {
        p_Var11 = (_capture_line *)operator_new(0xd0);
        local_3d8[0] = p_Var11;
        memcpy(p_Var11,&local_308,0xd0);
        if (local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<_capture_line*,std::allocator<_capture_line*>>::
          _M_realloc_insert<_capture_line*const&>
                    ((vector<_capture_line*,std::allocator<_capture_line*>> *)&local_448,
                     (iterator)
                     local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_3d8);
        }
        else {
          *local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
           super__Vector_impl_data._M_finish = p_Var11;
          local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        iVar6 = strcmp(local_308.registry_name,local_400);
        if (iVar6 == 0) {
          p_Var11 = (_capture_line *)operator_new(0xd0);
          local_3d8[0] = p_Var11;
          memcpy(p_Var11,&local_308,0xd0);
          if (local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<_capture_line*,std::allocator<_capture_line*>>::
            _M_realloc_insert<_capture_line*const&>
                      ((vector<_capture_line*,std::allocator<_capture_line*>> *)&local_468,
                       (iterator)
                       local_468.
                       super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
                       .super__Vector_impl_data._M_finish,local_3d8);
          }
          else {
            *local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
             .super__Vector_impl_data._M_finish = p_Var11;
            local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          AddLine(pCVar3,&local_308,true);
        }
      }
    }
    if (!bVar26 || ((!bVar25 || ((!bVar23 || !bVar22) || (!bVar21 || !bVar20))) || !bVar24))
    goto LAB_00152890;
  }
  if (local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar9 = (long)local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar18 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e
               ,(_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)
                CaptureLineIsLargerCount);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )pp_Var2,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )__last,(_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)
                        CaptureLineIsLargerCount);
  }
  pCVar3 = local_478;
  if (local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      AddLine(pCVar3,local_468.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9],true);
      if (0xfe < uVar9) break;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)local_468.
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_468.
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pp_Var2 = local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pp_Var16 = local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar9 = (long)local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar18 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e
               ,(_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)
                CaptureLineIsLargerCount);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )pp_Var16,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )pp_Var2,
               (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)CaptureLineIsLargerCount
              );
  }
  pCVar3 = local_478;
  if (local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      AddLine(pCVar3,local_448.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9],true);
      if (0xfe < uVar9) break;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)local_448.
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_448.
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pp_Var2 = local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pp_Var16 = local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar9 = (long)local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar18 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ulong)(((uint)lVar18 ^ 0x3f) * 2) ^ 0x7e
               ,(_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)
                CaptureLineIsLargerCount);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<_capture_line**,std::vector<_capture_line*,std::allocator<_capture_line*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_capture_line*,_capture_line*)>>
              ((__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )pp_Var16,
               (__normal_iterator<_capture_line_**,_std::vector<_capture_line_*,_std::allocator<_capture_line_*>_>_>
                )pp_Var2,
               (_Iter_comp_iter<bool_(*)(_capture_line_*,__capture_line_*)>)CaptureLineIsLargerCount
              );
  }
  pCVar3 = local_478;
  if (local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      AddLine(pCVar3,local_428.super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9],true);
      if (0xfe < uVar9) break;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)local_428.
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_428.
                                   super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pp_Var16 = (pCVar3->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  lVar18 = (long)(pCVar3->summary).
                 super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pp_Var16;
  if (lVar18 != 0) {
    lVar18 = lVar18 >> 3;
    lVar15 = 0;
    do {
      p_Var11 = pp_Var16[lVar15];
      iVar6 = strcmp(p_Var11->registry_name,local_410);
      if ((iVar6 == 0) && (uVar1 = (p_Var11->field_2).key_number, uVar1 - 1 < 0x3f)) {
        p_Var11->count = p_Var11->count + local_238[uVar1];
        local_238[uVar1] = 0;
      }
      lVar15 = lVar15 + 1;
    } while (lVar18 + (ulong)(lVar18 == 0) != lVar15);
  }
  pcVar7 = local_410;
  pCVar3 = local_478;
  lVar18 = 0;
  do {
    if (local_238[lVar18] != 0) {
      local_398 = 0;
      local_394.key_number = (int)lVar18;
      local_310 = local_238[lVar18];
      sVar10 = strlen(pcVar7);
      memcpy((CaptureLine *)local_3d8,pcVar7,sVar10 + 1);
      AddLine(pCVar3,(CaptureLine *)local_3d8,true);
      local_238[lVar18] = 0;
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x40);
  Sort(pCVar3);
  goto LAB_00152890;
}

Assistant:

bool CaptureSummary::Merge(size_t nb_summaries, CaptureSummary ** cs)
{
    bool ret = true;
    size_t max_size = 0;
    size_t complete_size = 0;
    std::vector<CaptureLine *> complete;
    std::vector<CaptureLine *> leaked_tld;
    std::vector<CaptureLine*> leaked_2ld;
    std::vector<CaptureLine *> frequent_tld;
    char const * leak_tld_id = NULL;
    char const * leak_2ld_id = NULL;
    char const * frequent_tld_id = NULL;
    char const * local_tld_id = NULL;
    char const * leak_by_length_id = NULL;
    char const* name_list_id = NULL;
    char const* addr_list_id = NULL;
    CaptureLine current_line;
    uint64_t nb_locally_leaked_tld = 0;
    CaptureLine *local_leak = new CaptureLine;
    uint64_t skipped_tld_length[64];

    memset(skipped_tld_length, 0, sizeof(skipped_tld_length));

    if (ret)
    {
        leak_tld_id = DnsStats::GetTableName(REGISTRY_DNS_LeakedTLD);
        leak_2ld_id = DnsStats::GetTableName(REGISTRY_DNS_LEAK_2NDLEVEL);
        frequent_tld_id = DnsStats::GetTableName(REGISTRY_DNS_Frequent_TLD_Usage);
        local_tld_id = DnsStats::GetTableName(REGISTRY_DNS_Local_TLD_Usage_Count);
        leak_by_length_id = DnsStats::GetTableName(REGISTRY_DNS_LeakByLength);
        name_list_id = DnsStats::GetTableName(REGISTRY_DNS_ERRONEOUS_NAME_LIST);
        addr_list_id = DnsStats::GetTableName(REGISTRY_DNS_ADDRESS_LIST);

        ret = (leak_tld_id != NULL && frequent_tld_id != NULL && local_tld_id != NULL && leak_by_length_id != NULL && local_leak != NULL
            && name_list_id != NULL && addr_list_id != NULL);
    }

    /* Compute the plausible max size and the complete size */
    for (size_t i = 0; ret && i < nb_summaries; i++)
    {
        if (cs[i]->Size() > max_size)
        {
            max_size = cs[i]->Size();
        }

        complete_size += cs[i]->Size();
    }

    /* Create a complete list that contains all the summaries */
    if (ret)
    {
        complete.reserve(complete_size);
        leaked_tld.reserve(48 * nb_summaries);
        leaked_2ld.reserve(48 * nb_summaries);
        frequent_tld.reserve(16 * nb_summaries);
    }

    for (size_t i = 0; ret && i < nb_summaries; i++) {
        for (size_t j = 0; j < cs[i]->Size(); j++) {
            if (strcmp(cs[i]->summary[j]->registry_name, frequent_tld_id) == 0)
            {
                /* This is a TLD "frequently used" by a client. We will only consider it in the summary
                 * if it is part of the TLD frequently leaked to the root.
                 */  
                if (DnsStats::IsFrequentLeakTld((uint8_t *)cs[i]->summary[j]->key_value,
                    strlen(cs[i]->summary[j]->key_value))) {
                    complete.push_back(cs[i]->summary[j]);
                }
                else
                {
                    nb_locally_leaked_tld += cs[i]->summary[j]->count;
                }
            }
            else if (strcmp(cs[i]->summary[j]->registry_name, leak_tld_id) == 0)
            {
                /* This is a TLD "frequently leaked" to the root */
                if (cs[i]->summary[j]->count <= 4)
                {
                    size_t len = strlen(cs[i]->summary[j]->key_value);

                    if (len < 64)
                    {
                        skipped_tld_length[len]++;
                    }
                }
                else
                {
                    complete.push_back(cs[i]->summary[j]);
                }
            }
            /* TODO: if local leak present, add to total */
            else
            {
                complete.push_back(cs[i]->summary[j]);
            }
        }
    }

    if (ret && nb_locally_leaked_tld != 0)
    {
        local_leak->count = nb_locally_leaked_tld;
        local_leak->key_type = 0;
        local_leak->key_number = 0; 
        
        memcpy(local_leak->registry_name, local_tld_id, strlen(local_tld_id) + 1);

        complete.push_back(local_leak);
    }

    /* Sort the complete list */
    std::sort(complete.begin(), complete.end(), CaptureLineIsLower);

    /* Now go through the list and perform the summations.
     * Put the frequent tld, 2nd ld and tls usage in separate lists */
    Reserve(max_size + 64* nb_summaries);

    for (size_t i = 0; ret && i < complete.size();) {
        /* Read the next capture line */
        current_line = *complete[i++];

        /* Summarize all matching lines */
        while (i < complete.size() && CaptureLineIsSameKey(complete[i], &current_line)) {
            current_line.count += complete[i]->count;
            i++;
        }

        /* Add line to summary, or to one of the special registries */

        if (strcmp(current_line.registry_name, leak_tld_id) == 0) {
            CaptureLine *tld_line = new CaptureLine;

            if (tld_line != NULL)
            {
                memcpy(tld_line, &current_line, sizeof(CaptureLine));
                leaked_tld.push_back(tld_line);
            }
            else
            {
                ret = false;
            }
        }
        else if (strcmp(current_line.registry_name, leak_2ld_id) == 0) {
            CaptureLine* second_ld_line = new CaptureLine;

            if (second_ld_line != NULL)
            {
                memcpy(second_ld_line, &current_line, sizeof(CaptureLine));
                leaked_2ld.push_back(second_ld_line);
            }
            else
            {
                ret = false;
            }
        }
        else if (strcmp(current_line.registry_name, frequent_tld_id) == 0) {
            CaptureLine *tld_line = new CaptureLine;

            if (tld_line != NULL)
            {
                memcpy(tld_line, &current_line, sizeof(CaptureLine));
                frequent_tld.push_back(tld_line);
            }
            else
            {
                ret = false;
            }
        }
        else {
            AddLine(&current_line, true);
        }
    }

    /* Sort and tabulate the most used TLD. */
    if (ret) {
        std::sort(frequent_tld.begin(), frequent_tld.end(), CaptureLineIsLargerCount);
        for (size_t i = 0; i < frequent_tld.size() && i < 256; i++) {
            AddLine(frequent_tld[i], true);
        }
    }

    /* Sort and tabulate the most used 2LD. */
    if (ret) {
        std::sort(leaked_2ld.begin(), leaked_2ld.end(), CaptureLineIsLargerCount);
        for (size_t i = 0; i < leaked_2ld.size() && i < 256; i++) {
            AddLine(leaked_2ld[i], true);
        }
    }

    /* Sort and tabulate the most leaked TLD. 
     * TODO: tabulate the length of the discarded TLD, and correct the captured values */
    if (ret) {
        std::sort(leaked_tld.begin(), leaked_tld.end(), CaptureLineIsLargerCount);
        for (size_t i = 0; i < leaked_tld.size() && i < 256; i++) {
            AddLine(leaked_tld[i], true);
        }

        for (size_t i = 256; i < leaked_tld.size() && i < 256; i++) {
            size_t len = strlen(leaked_tld[i]->key_value);

            if (len < 64)
            {
                skipped_tld_length[len]++;
            }
        }
    }

    if (ret) {
        /* Add the leaked length to the current counts */
        for (size_t i = 0; i < summary.size(); i++)
        {
            if (strcmp(summary[i]->registry_name, leak_by_length_id) == 0 &&
                summary[i]->key_number > 0 &&
                summary[i]->key_number < 64)
            {
                summary[i]->count += skipped_tld_length[summary[i]->key_number];
                skipped_tld_length[summary[i]->key_number] = 0;
            }
        }

        for (int i = 0; i < 64; i++)
        {
            if (skipped_tld_length[i] != 0)
            {
                CaptureLine length_pattern;

                length_pattern.count = skipped_tld_length[i];
                length_pattern.key_type = 0;
                length_pattern.key_number = i;

                memcpy(length_pattern.registry_name, leak_by_length_id, strlen(leak_by_length_id) + 1);

                AddLine(&length_pattern, true);
                skipped_tld_length[i] = 0;
            }
        }
    }

    if (ret) {
        /* Sort the whole thing again */
        Sort();
    }

    /* Clean up */

    for (size_t i = 0; i < frequent_tld.size(); i++)
    {
        if (frequent_tld[i] != NULL)
        {
            delete frequent_tld[i];
            frequent_tld[i] = NULL;
        }
    }

    for (size_t i = 0; i < leaked_tld.size(); i++)
    {
        if (leaked_tld[i] != NULL)
        {
            delete leaked_tld[i];
            leaked_tld[i] = NULL;
        }
    }

    for (size_t i = 0; i < leaked_2ld.size(); i++)
    {
        if (leaked_2ld[i] != NULL)
        {
            delete leaked_2ld[i];
            leaked_2ld[i] = NULL;
        }
    }

    if (local_leak != NULL)
    {
        delete local_leak;
        local_leak = NULL;
    }

    return ret;
}